

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall
QScrollerPrivate::createScrollToSegments
          (QScrollerPrivate *this,qreal v,qreal deltaTime,qreal endPos,Orientation orientation,
          ScrollType type)

{
  Type curve;
  QDebug *pQVar1;
  QQueue<QScrollerPrivate::ScrollSegment> *this_00;
  long in_FS_OFFSET;
  double deltaPos;
  double startPos;
  QDebug local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->ySegments;
  if (orientation == Horizontal) {
    this_00 = &this->xSegments;
  }
  QList<QScrollerPrivate::ScrollSegment>::clear
            (&this_00->super_QList<QScrollerPrivate::ScrollSegment>);
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar1 = QDebug::operator<<(&local_30,"+++ createScrollToSegments: t:");
    pQVar1 = QDebug::operator<<(pQVar1,deltaTime);
    pQVar1 = QDebug::operator<<(pQVar1,"ep:");
    pQVar1 = QDebug::operator<<(pQVar1,endPos);
    pQVar1 = QDebug::operator<<(pQVar1,"o:");
    QDebug::operator<<(pQVar1,orientation);
    QDebug::~QDebug(&local_30);
  }
  startPos = (&(this->contentPosition).xp)[orientation != Horizontal] +
             (&(this->overshootPosition).xp)[orientation != Horizontal];
  deltaPos = (endPos - startPos) * 0.5;
  pushSegment(this,type,deltaTime * 0.3,1.0,startPos,deltaPos,startPos + deltaPos,InQuad,orientation
             );
  curve = QEasingCurve::type();
  pushSegment(this,type,deltaTime * 0.7,1.0,startPos + deltaPos,deltaPos,endPos,curve,orientation);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::createScrollToSegments(qreal v, qreal deltaTime, qreal endPos,
                                              Qt::Orientation orientation, ScrollType type)
{
    Q_UNUSED(v);

    if (orientation == Qt::Horizontal)
        xSegments.clear();
    else
        ySegments.clear();

    qCDebug(lcScroller) << "+++ createScrollToSegments: t:" << deltaTime << "ep:"
                        << endPos << "o:" << int(orientation);

    const QScrollerPropertiesPrivate *sp = properties.d.data();

    qreal startPos = (orientation == Qt::Horizontal) ? contentPosition.x() + overshootPosition.x()
                                                     : contentPosition.y() + overshootPosition.y();
    qreal deltaPos = (endPos - startPos) / 2;

    pushSegment(type, deltaTime * qreal(0.3), qreal(1.0), startPos, deltaPos, startPos + deltaPos,
                QEasingCurve::InQuad, orientation);
    pushSegment(type, deltaTime * qreal(0.7), qreal(1.0), startPos + deltaPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}